

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBIStateDescriptor::~RBBIStateDescriptor(RBBIStateDescriptor *this)

{
  if (this->fPositions != (UVector *)0x0) {
    (*(this->fPositions->super_UObject)._vptr_UObject[1])();
  }
  if (this->fDtran != (UVector32 *)0x0) {
    (*(this->fDtran->super_UObject)._vptr_UObject[1])();
  }
  if (this->fTagVals != (UVector *)0x0) {
    (*(this->fTagVals->super_UObject)._vptr_UObject[1])();
  }
  this->fTagVals = (UVector *)0x0;
  this->fPositions = (UVector *)0x0;
  this->fDtran = (UVector32 *)0x0;
  return;
}

Assistant:

RBBIStateDescriptor::~RBBIStateDescriptor() {
    delete       fPositions;
    delete       fDtran;
    delete       fTagVals;
    fPositions = NULL;
    fDtran     = NULL;
    fTagVals   = NULL;
}